

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void duckdb_fmt::v6::internal::
     handle_int_type_spec<duckdb_fmt::v6::basic_format_specs<char>,duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::int_writer<unsigned__int128,duckdb_fmt::v6::basic_format_specs<char>>>
               (basic_format_specs<char> *specs,
               int_writer<unsigned___int128,_duckdb_fmt::v6::basic_format_specs<char>_> *handler)

{
  byte bVar1;
  long *plVar2;
  size_type *psVar3;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (specs->thousands == '\0') {
    bVar1 = specs->type;
    if (bVar1 < 100) {
      if (bVar1 < 0x4c) {
        if (bVar1 == 0) goto LAB_00d935f3;
        if (bVar1 == 0x42) {
LAB_00d93570:
          basic_writer<duckdb_fmt::v6::buffer_range<char>_>::
          int_writer<unsigned___int128,_duckdb_fmt::v6::basic_format_specs<char>_>::on_bin(handler);
          return;
        }
      }
      else {
        if (bVar1 == 0x4c) goto LAB_00d93508;
        if (bVar1 == 0x58) goto LAB_00d93552;
        if (bVar1 == 0x62) goto LAB_00d93570;
      }
LAB_00d9358f:
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_58,'\x01');
      std::operator+(&local_38,"Invalid type specifier \"",&local_58);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_38);
      local_78._M_dataplus._M_p = (pointer)*plVar2;
      psVar3 = (size_type *)(plVar2 + 2);
      if ((size_type *)local_78._M_dataplus._M_p == psVar3) {
        local_78.field_2._M_allocated_capacity = *psVar3;
        local_78.field_2._8_8_ = plVar2[3];
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      }
      else {
        local_78.field_2._M_allocated_capacity = *psVar3;
      }
      local_78._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      basic_writer<duckdb_fmt::v6::buffer_range<char>_>::
      int_writer<unsigned___int128,_duckdb_fmt::v6::basic_format_specs<char>_>::on_error
                (handler,&local_78);
    }
    if (bVar1 < 0x6e) {
      if (bVar1 == 100) {
LAB_00d935f3:
        basic_writer<duckdb_fmt::v6::buffer_range<char>_>::
        int_writer<unsigned___int128,_duckdb_fmt::v6::basic_format_specs<char>_>::on_dec(handler);
        return;
      }
      if (bVar1 != 0x6c) goto LAB_00d9358f;
    }
    else if (bVar1 != 0x6e) {
      if (bVar1 == 0x6f) {
        basic_writer<duckdb_fmt::v6::buffer_range<char>_>::
        int_writer<unsigned___int128,_duckdb_fmt::v6::basic_format_specs<char>_>::on_oct(handler);
        return;
      }
      if (bVar1 == 0x78) {
LAB_00d93552:
        basic_writer<duckdb_fmt::v6::buffer_range<char>_>::
        int_writer<unsigned___int128,_duckdb_fmt::v6::basic_format_specs<char>_>::on_hex(handler);
        return;
      }
      goto LAB_00d9358f;
    }
  }
LAB_00d93508:
  basic_writer<duckdb_fmt::v6::buffer_range<char>_>::
  int_writer<unsigned___int128,_duckdb_fmt::v6::basic_format_specs<char>_>::on_num(handler);
  return;
}

Assistant:

FMT_CONSTEXPR void handle_int_type_spec(const Spec& specs, Handler&& handler) {
  if (specs.thousands != '\0') {
    handler.on_num();
    return;
  }
  switch (specs.type) {
  case 0:
  case 'd':
    handler.on_dec();
    break;
  case 'x':
  case 'X':
    handler.on_hex();
    break;
  case 'b':
  case 'B':
    handler.on_bin();
    break;
  case 'o':
    handler.on_oct();
    break;
  case 'n':
  case 'l':
  case 'L':
    handler.on_num();
    break;
  default:
    handler.on_error("Invalid type specifier \"" + std::string(1, specs.type) + "\" for formatting a value of type int");
  }
}